

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subdivision.cpp
# Opt level: O0

void __thiscall
CatmullClarkSubdivider::InternSubdivide
          (CatmullClarkSubdivider *this,aiMesh **smesh,size_t nmesh,aiMesh **out,uint num)

{
  allocator<unsigned_int> *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  value_type vVar5;
  long lVar6;
  aiMesh **ppaVar7;
  aiMesh **nmesh_00;
  bool bVar8;
  reference pvVar9;
  ulong uVar10;
  aiFace *paVar11;
  reference pvVar12;
  reference pvVar13;
  reference ppVar14;
  Logger *pLVar15;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar16;
  size_type sVar17;
  basic_formatter *this_00;
  size_type sVar18;
  uint *puVar19;
  aiMesh *paVar20;
  ulong *puVar21;
  aiVector3D *paVar22;
  aiColor4D *paVar23;
  void *pvVar24;
  reference pvVar25;
  reference pvVar26;
  reference ppaVar27;
  Vertex *__dest;
  ai_real pRadius;
  uint local_1938;
  uint local_1920;
  uint local_18f0;
  uint local_18d8;
  aiColor4t<float> *local_18b0;
  aiVector3t<float> *local_1880;
  aiVector3t<float> *local_1850;
  aiVector3t<float> *local_1828;
  aiVector3t<float> *local_17f8;
  aiVector3t<float> *local_17c8;
  aiFace *local_17a0;
  uint local_16ac;
  aiMesh **local_1660;
  size_t i_9;
  undefined1 local_1650 [8];
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> tmp;
  Vertex local_1528;
  Vertex local_1418;
  Vertex local_1308;
  Vertex local_11f8;
  Vertex local_10e8;
  float local_fd8;
  float local_fd4;
  float divsq;
  float div;
  key_type_conflict1 local_ec0;
  mapped_type *local_eb8;
  Edge *c1;
  mapped_type *local_ea8;
  Edge *c0;
  uint m_1;
  bool haveit_1;
  aiFace *f_3;
  size_t nidx;
  aiMesh *mp_1;
  uint o;
  Vertex R;
  Vertex F;
  uint cnt;
  uint *adj;
  TouchedOVertex *ov;
  key_type_conflict1 kStack_b30;
  uint org;
  mapped_type *local_b28;
  Edge *e1;
  mapped_type *local_b18;
  Edge *e0;
  aiFace *faceOut;
  aiFace *paStack_b00;
  uint a_2;
  aiFace *face_2;
  uint n_4;
  uint v;
  uint i_8;
  uint i_7;
  uint i_6;
  uint a_1;
  aiMesh *mout;
  aiMesh *minp_2;
  size_t t_6;
  Vertex local_ac0;
  bool local_9ad;
  pair<bool,_Assimp::Vertex> local_9ac;
  undefined1 local_898 [8];
  vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
  new_points;
  uint i_5;
  bool haveit;
  aiFace *f_2;
  aiMesh *msh;
  size_t n_3;
  uint fidx;
  uint m;
  size_t t_5;
  uint n_2;
  aiFace *f_1;
  uint i_4;
  aiMesh *minp_1;
  size_t t_4;
  size_t i_3;
  uint cur;
  uint n_1;
  aiFace *f;
  uint i_2;
  aiMesh *minp;
  size_t t_3;
  undefined1 local_7f0 [8];
  UIntVector ofsadjvec;
  undefined1 local_7d0 [8];
  UIntVector cntadjfac;
  undefined1 local_7b0 [8];
  UIntVector faceadjac;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  string local_618;
  _Self local_5f8;
  _Self local_5f0;
  iterator it;
  uint bad_cnt;
  Vertex local_4d0;
  Vertex local_3c0;
  key_type_conflict1 local_2b0;
  mapped_type *local_2a8;
  Edge *e;
  uint local_298;
  uint mp [2];
  uint id [2];
  uint p;
  aiFace *face_1;
  uint i_1;
  aiMesh *mesh_2;
  size_t t_2;
  EdgeMap edges;
  uint local_124;
  uint a;
  Vertex *c;
  aiFace *face;
  uint i;
  aiMesh *mesh_1;
  size_t n;
  size_t t_1;
  uint nfacesout;
  vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> centroids;
  uint num_unique;
  long local_c0;
  aiMesh *mesh;
  size_t t;
  uint local_a8;
  uint totvert;
  uint totfaces;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  moffsets;
  undefined1 local_78 [8];
  SpatialSort spatial;
  UIntVector maptbl;
  uint local_30;
  uint eh_tmp1__;
  uint eh_tmp0__;
  uint num_local;
  aiMesh **out_local;
  size_t nmesh_local;
  aiMesh **smesh_local;
  CatmullClarkSubdivider *this_local;
  
  eh_tmp1__ = num;
  _eh_tmp0__ = out;
  out_local = (aiMesh **)nmesh;
  nmesh_local = (size_t)smesh;
  smesh_local = (aiMesh **)this;
  if (smesh == (aiMesh **)0x0 || out == (aiMesh **)0x0) {
    __assert_fail("__null != smesh && __null != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Subdivision.cpp"
                  ,0xec,
                  "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                 );
  }
  if (num != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &spatial.mPositions.
                super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Assimp::SpatialSort::SpatialSort((SpatialSort *)local_78);
    ppaVar7 = out_local;
    std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator
              ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)((long)&totvert + 3));
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&totfaces,(size_type)ppaVar7,
             (allocator<std::pair<unsigned_int,_unsigned_int>_> *)((long)&totvert + 3));
    std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator
              ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)((long)&totvert + 3));
    local_a8 = 0;
    t._4_4_ = 0;
    for (mesh = (aiMesh *)0x0; mesh < out_local; mesh = (aiMesh *)((long)&mesh->mPrimitiveTypes + 1)
        ) {
      local_c0 = *(long *)(nmesh_local + (long)mesh * 8);
      Assimp::SpatialSort::Append
                ((SpatialSort *)local_78,*(aiVector3D **)(local_c0 + 0x10),*(uint *)(local_c0 + 4),
                 0xc,false);
      std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
                ((pair<unsigned_int,_unsigned_int> *)&stack0xffffffffffffff38,&local_a8,
                 (uint *)((long)&t + 4));
      pvVar9 = std::
               vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             *)&totfaces,(size_type)mesh);
      std::pair<unsigned_int,_unsigned_int>::operator=(pvVar9,(type)&stack0xffffffffffffff38);
      local_a8 = *(int *)(local_c0 + 8) + local_a8;
      t._4_4_ = *(int *)(local_c0 + 4) + t._4_4_;
    }
    Assimp::SpatialSort::Finalize((SpatialSort *)local_78);
    pRadius = Assimp::ComputePositionEpsilon((aiMesh **)nmesh_local,(size_t)out_local);
    centroids.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         Assimp::SpatialSort::GenerateMappingTable
                   ((SpatialSort *)local_78,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &spatial.mPositions.
                     super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,pRadius);
    uVar10 = (ulong)local_a8;
    std::allocator<Assimp::Vertex>::allocator((allocator<Assimp::Vertex> *)((long)&t_1 + 7));
    std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::vector
              ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)&nfacesout,uVar10,
               (allocator<Assimp::Vertex> *)((long)&t_1 + 7));
    std::allocator<Assimp::Vertex>::~allocator((allocator<Assimp::Vertex> *)((long)&t_1 + 7));
    t_1._0_4_ = 0;
    mesh_1 = (aiMesh *)0x0;
    for (n = 0; n < out_local; n = n + 1) {
      paVar20 = *(aiMesh **)(nmesh_local + n * 8);
      for (face._4_4_ = 0; face._4_4_ < paVar20->mNumFaces; face._4_4_ = face._4_4_ + 1) {
        paVar11 = paVar20->mFaces + face._4_4_;
        pvVar12 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::operator[]
                            ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)&nfacesout,
                             (size_type)mesh_1);
        for (local_124 = 0; local_124 < paVar11->mNumIndices; local_124 = local_124 + 1) {
          Assimp::Vertex::Vertex
                    ((Vertex *)((long)&edges._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),
                     paVar20,paVar11->mIndices[local_124]);
          Assimp::Vertex::operator+=
                    (pvVar12,(Vertex *)
                             ((long)&edges._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
        }
        Assimp::Vertex::operator/=(pvVar12,(float)paVar11->mNumIndices);
        t_1._0_4_ = paVar11->mNumIndices + (uint)t_1;
        mesh_1 = (aiMesh *)((long)&mesh_1->mPrimitiveTypes + 1);
      }
    }
    std::
    map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
    ::map((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
           *)&t_2);
    for (mesh_2 = (aiMesh *)0x0; mesh_2 < out_local;
        mesh_2 = (aiMesh *)((long)&mesh_2->mPrimitiveTypes + 1)) {
      paVar20 = *(aiMesh **)(nmesh_local + (long)mesh_2 * 8);
      for (face_1._4_4_ = 0; face_1._4_4_ < paVar20->mNumFaces; face_1._4_4_ = face_1._4_4_ + 1) {
        paVar11 = paVar20->mFaces + face_1._4_4_;
        for (id[0] = 0; id[0] < paVar11->mNumIndices; id[0] = id[0] + 1) {
          mp[0] = paVar11->mIndices[id[0]];
          if (id[0] == paVar11->mNumIndices - 1) {
            local_16ac = 0;
          }
          else {
            local_16ac = id[0] + 1;
          }
          mp[1] = paVar11->mIndices[local_16ac];
          pvVar9 = std::
                   vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 *)&totfaces,(size_type)mesh_2);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &spatial.mPositions.
                                super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(pvVar9->second + mp[0]));
          e._4_4_ = *pvVar13;
          pvVar9 = std::
                   vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 *)&totfaces,(size_type)mesh_2);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &spatial.mPositions.
                                super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(pvVar9->second + mp[1]));
          local_298 = *pvVar13;
          local_30 = e._4_4_;
          maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = local_298;
          if (e._4_4_ < local_298) {
            std::swap<unsigned_int>
                      (&local_30,
                       (uint *)((long)&maptbl.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          }
          else {
            mydummy();
          }
          local_2b0 = CONCAT44(maptbl.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,local_30);
          local_2a8 = std::
                      map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                      ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                    *)&t_2,&local_2b0);
          local_2a8->ref = local_2a8->ref + 1;
          if (local_2a8->ref < 3) {
            if (local_2a8->ref == 1) {
              Assimp::Vertex::Vertex(&local_4d0,paVar20,mp[0]);
              Assimp::Vertex::Vertex((Vertex *)&stack0xfffffffffffffa20,paVar20,mp[1]);
              Assimp::operator+(&local_3c0,&local_4d0,(Vertex *)&stack0xfffffffffffffa20);
              __dest = &local_2a8->midpoint;
              memcpy(__dest,&local_3c0,0x110);
              memcpy(local_2a8,__dest,0x110);
              Assimp::Vertex::operator*=(&local_2a8->midpoint,0.5);
            }
            pvVar9 = std::
                     vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                   *)&totfaces,(size_type)mesh_2);
            pvVar12 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::operator[]
                                ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)
                                 &nfacesout,(ulong)(pvVar9->first + face_1._4_4_));
            Assimp::Vertex::operator+=(&local_2a8->edge_point,pvVar12);
          }
        }
      }
    }
    it._M_node._4_4_ = 0;
    local_5f0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
         ::begin((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                  *)&t_2);
    while( true ) {
      local_5f8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
           ::end((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                  *)&t_2);
      bVar8 = std::operator!=(&local_5f0,&local_5f8);
      if (!bVar8) break;
      ppVar14 = std::
                _Rb_tree_iterator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>::
                operator*(&local_5f0);
      if ((ppVar14->second).ref < 2) {
        ppVar14 = std::
                  _Rb_tree_iterator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>::
                  operator*(&local_5f0);
        if ((ppVar14->second).ref == 0) {
          __assert_fail("(*it).second.ref",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Subdivision.cpp"
                        ,0x150,
                        "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                       );
        }
        it._M_node._4_4_ = it._M_node._4_4_ + 1;
      }
      ppVar14 = std::
                _Rb_tree_iterator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>::
                operator*(&local_5f0);
      uVar2 = (ppVar14->second).ref;
      ppVar14 = std::
                _Rb_tree_iterator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>::
                operator*(&local_5f0);
      Assimp::Vertex::operator*=(&(ppVar14->second).edge_point,1.0 / ((float)uVar2 + 2.0));
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>::
      operator++(&local_5f0);
    }
    if (it._M_node._4_4_ != 0) {
      pLVar15 = Assimp::DefaultLogger::get();
      Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[31]>(&local_790,(char (*) [31])"Catmull-Clark Subdivider: got ");
      pbVar16 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                ::operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_790,(uint *)((long)&it._M_node + 4));
      pbVar16 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                ::operator_(pbVar16,(char (*) [44])" bad edges touching only one face (totally ");
      sVar17 = std::
               map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
               ::size((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                       *)&t_2);
      faceadjac.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)sVar17;
      pbVar16 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                ::operator_(pbVar16,(uint *)((long)&faceadjac.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4));
      this_00 = (basic_formatter *)
                Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                ::operator_(pbVar16,(char (*) [10])" edges). ");
      Assimp::Formatter::basic_formatter::operator_cast_to_string(&local_618,this_00);
      Assimp::Logger::debug(pLVar15,&local_618);
      std::__cxx11::string::~string((string *)&local_618);
      Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_790);
    }
    uVar10 = (ulong)(uint)t_1;
    paVar1 = (allocator<unsigned_int> *)
             ((long)&cntadjfac.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_int>::allocator(paVar1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7b0,uVar10,paVar1);
    std::allocator<unsigned_int>::~allocator
              ((allocator<unsigned_int> *)
               ((long)&cntadjfac.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &spatial.mPositions.
                         super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ofsadjvec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    paVar1 = (allocator<unsigned_int> *)
             ((long)&ofsadjvec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
    std::allocator<unsigned_int>::allocator(paVar1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0,sVar18,
               (value_type_conflict3 *)
               ((long)&ofsadjvec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar1);
    std::allocator<unsigned_int>::~allocator
              ((allocator<unsigned_int> *)
               ((long)&ofsadjvec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    sVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &spatial.mPositions.
                         super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    t_3._4_4_ = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&t_3 + 3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7f0,sVar18 + 1,
               (value_type_conflict3 *)((long)&t_3 + 4),(allocator<unsigned_int> *)((long)&t_3 + 3))
    ;
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&t_3 + 3));
    for (minp = (aiMesh *)0x0; minp < out_local; minp = (aiMesh *)((long)&minp->mPrimitiveTypes + 1)
        ) {
      lVar6 = *(long *)(nmesh_local + (long)minp * 8);
      for (f._4_4_ = 0; f._4_4_ < *(uint *)(lVar6 + 8); f._4_4_ = f._4_4_ + 1) {
        puVar19 = (uint *)(*(long *)(lVar6 + 0xd0) + (ulong)f._4_4_ * 0x10);
        for (i_3._4_4_ = 0; i_3._4_4_ < *puVar19; i_3._4_4_ = i_3._4_4_ + 1) {
          pvVar9 = std::
                   vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 *)&totfaces,(size_type)minp);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &spatial.mPositions.
                                super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(pvVar9->second +
                                      *(int *)(*(long *)(puVar19 + 2) + (ulong)i_3._4_4_ * 4)));
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0,
                               (ulong)*pvVar13);
          *pvVar13 = *pvVar13 + 1;
        }
      }
    }
    i_3._0_4_ = 0;
    for (t_4 = 0; sVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      local_7d0), t_4 < sVar18; t_4 = t_4 + 1) {
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7f0,t_4 + 1)
      ;
      *pvVar13 = (value_type)i_3;
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0,t_4);
      i_3._0_4_ = *pvVar13 + (value_type)i_3;
    }
    for (minp_1 = (aiMesh *)0x0; minp_1 < out_local;
        minp_1 = (aiMesh *)((long)&minp_1->mPrimitiveTypes + 1)) {
      lVar6 = *(long *)(nmesh_local + (long)minp_1 * 8);
      for (f_1._4_4_ = 0; f_1._4_4_ < *(uint *)(lVar6 + 8); f_1._4_4_ = f_1._4_4_ + 1) {
        puVar19 = (uint *)(*(long *)(lVar6 + 0xd0) + (ulong)f_1._4_4_ * 0x10);
        for (t_5._4_4_ = 0; t_5._4_4_ < *puVar19; t_5._4_4_ = t_5._4_4_ + 1) {
          pvVar9 = std::
                   vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 *)&totfaces,(size_type)minp_1);
          uVar2 = pvVar9->first;
          pvVar9 = std::
                   vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 *)&totfaces,(size_type)minp_1);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &spatial.mPositions.
                                super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(pvVar9->second +
                                      *(int *)(*(long *)(puVar19 + 2) + (ulong)t_5._4_4_ * 4)));
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7f0,
                               (ulong)(*pvVar13 + 1));
          uVar3 = *pvVar13;
          *pvVar13 = uVar3 + 1;
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7b0,
                               (ulong)uVar3);
          *pvVar13 = uVar2 + f_1._4_4_;
        }
      }
    }
    for (_fidx = 0;
        sVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7f0),
        _fidx < sVar18 - 1; _fidx = _fidx + 1) {
      n_3._4_4_ = 0;
LAB_00b89e50:
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0,_fidx);
      if (n_3._4_4_ < *pvVar13) {
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7f0,_fidx)
        ;
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7b0,
                             (ulong)(*pvVar13 + n_3._4_4_));
        uVar2 = *pvVar13;
        if (local_a8 <= uVar2) {
          __assert_fail("fidx < totfaces",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Subdivision.cpp"
                        ,0x185,
                        "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                       );
        }
        for (msh = (aiMesh *)0x1; msh < out_local; msh = (aiMesh *)((long)&msh->mPrimitiveTypes + 1)
            ) {
          pvVar9 = std::
                   vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 *)&totfaces,(size_type)msh);
          if (uVar2 < pvVar9->first) {
            lVar6 = *(long *)(*(long *)((nmesh_local - 8) + (long)msh * 8) + 0xd0);
            pvVar9 = std::
                     vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                   *)&totfaces,(size_type)&msh[-1].field_0x51f);
            puVar19 = (uint *)(lVar6 + (ulong)(uVar2 - pvVar9->first) * 0x10);
            new_points.
            super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
            new_points.
            super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            goto LAB_00b89fab;
          }
        }
        goto LAB_00b8a0a0;
      }
    }
    uVar10 = (ulong)centroids.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    local_9ad = false;
    Assimp::Vertex::Vertex(&local_ac0);
    std::pair<bool,_Assimp::Vertex>::pair<bool,_Assimp::Vertex,_true>
              (&local_9ac,&local_9ad,&local_ac0);
    std::allocator<std::pair<bool,_Assimp::Vertex>_>::allocator
              ((allocator<std::pair<bool,_Assimp::Vertex>_> *)((long)&t_6 + 7));
    std::vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
    ::vector((vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
              *)local_898,uVar10,&local_9ac,
             (allocator<std::pair<bool,_Assimp::Vertex>_> *)((long)&t_6 + 7));
    std::allocator<std::pair<bool,_Assimp::Vertex>_>::~allocator
              ((allocator<std::pair<bool,_Assimp::Vertex>_> *)((long)&t_6 + 7));
    for (minp_2 = (aiMesh *)0x0; minp_2 < out_local;
        minp_2 = (aiMesh *)((long)&minp_2->mPrimitiveTypes + 1)) {
      mout = *(aiMesh **)(nmesh_local + (long)minp_2 * 8);
      paVar20 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar20);
      _eh_tmp0__[(long)minp_2] = paVar20;
      for (i_7 = 0; i_7 < mout->mNumFaces; i_7 = i_7 + 1) {
        paVar20->mNumFaces = mout->mFaces[i_7].mNumIndices + paVar20->mNumFaces;
      }
      uVar10 = (ulong)paVar20->mNumFaces;
      _i_6 = paVar20;
      puVar21 = (ulong *)operator_new__(uVar10 << 4 | 8);
      *puVar21 = uVar10;
      paVar11 = (aiFace *)(puVar21 + 1);
      if (uVar10 != 0) {
        local_17a0 = paVar11;
        do {
          aiFace::aiFace(local_17a0);
          local_17a0 = local_17a0 + 1;
        } while (local_17a0 != paVar11 + uVar10);
      }
      _i_6->mFaces = paVar11;
      _i_6->mNumVertices = _i_6->mNumFaces << 2;
      uVar10 = (ulong)_i_6->mNumVertices;
      paVar22 = (aiVector3D *)operator_new__(uVar10 * 0xc);
      if (uVar10 != 0) {
        local_17c8 = paVar22;
        do {
          aiVector3t<float>::aiVector3t(local_17c8);
          local_17c8 = local_17c8 + 1;
        } while (local_17c8 != paVar22 + uVar10);
      }
      _i_6->mVertices = paVar22;
      _i_6->mPrimitiveTypes = 8;
      _i_6->mMaterialIndex = mout->mMaterialIndex;
      bVar8 = aiMesh::HasNormals(mout);
      if (bVar8) {
        uVar10 = (ulong)_i_6->mNumVertices;
        paVar22 = (aiVector3D *)operator_new__(uVar10 * 0xc);
        if (uVar10 != 0) {
          local_17f8 = paVar22;
          do {
            aiVector3t<float>::aiVector3t(local_17f8);
            local_17f8 = local_17f8 + 1;
          } while (local_17f8 != paVar22 + uVar10);
        }
        _i_6->mNormals = paVar22;
      }
      bVar8 = aiMesh::HasTangentsAndBitangents(mout);
      if (bVar8) {
        uVar10 = (ulong)_i_6->mNumVertices;
        paVar22 = (aiVector3D *)operator_new__(uVar10 * 0xc);
        if (uVar10 != 0) {
          local_1828 = paVar22;
          do {
            aiVector3t<float>::aiVector3t(local_1828);
            local_1828 = local_1828 + 1;
          } while (local_1828 != paVar22 + uVar10);
        }
        _i_6->mTangents = paVar22;
        uVar10 = (ulong)_i_6->mNumVertices;
        paVar22 = (aiVector3D *)operator_new__(uVar10 * 0xc);
        if (uVar10 != 0) {
          local_1850 = paVar22;
          do {
            aiVector3t<float>::aiVector3t(local_1850);
            local_1850 = local_1850 + 1;
          } while (local_1850 != paVar22 + uVar10);
        }
        _i_6->mBitangents = paVar22;
      }
      i_8 = 0;
      while (bVar8 = aiMesh::HasTextureCoords(mout,i_8), bVar8) {
        uVar10 = (ulong)_i_6->mNumVertices;
        paVar22 = (aiVector3D *)operator_new__(uVar10 * 0xc);
        if (uVar10 != 0) {
          local_1880 = paVar22;
          do {
            aiVector3t<float>::aiVector3t(local_1880);
            local_1880 = local_1880 + 1;
          } while (local_1880 != paVar22 + uVar10);
        }
        _i_6->mTextureCoords[i_8] = paVar22;
        _i_6->mNumUVComponents[i_8] = mout->mNumUVComponents[i_8];
        i_8 = i_8 + 1;
      }
      v = 0;
      while (bVar8 = aiMesh::HasVertexColors(mout,v), bVar8) {
        uVar10 = (ulong)_i_6->mNumVertices;
        paVar23 = (aiColor4D *)operator_new__(uVar10 << 4);
        if (uVar10 != 0) {
          local_18b0 = paVar23;
          do {
            aiColor4t<float>::aiColor4t(local_18b0);
            local_18b0 = local_18b0 + 1;
          } while (local_18b0 != paVar23 + uVar10);
        }
        _i_6->mColors[v] = paVar23;
        v = v + 1;
      }
      _i_6->mNumVertices = _i_6->mNumFaces << 2;
      face_2._4_4_ = 0;
      face_2._0_4_ = 0;
      for (n_4 = 0; n_4 < mout->mNumFaces; n_4 = n_4 + 1) {
        paStack_b00 = mout->mFaces + n_4;
        for (faceOut._4_4_ = 0; faceOut._4_4_ < paStack_b00->mNumIndices;
            faceOut._4_4_ = faceOut._4_4_ + 1) {
          uVar10 = (ulong)(uint)face_2;
          face_2._0_4_ = (uint)face_2 + 1;
          e0 = (Edge *)(_i_6->mFaces + uVar10);
          (e0->edge_point).position.x = 5.60519e-45;
          pvVar24 = operator_new__(0x10);
          *(void **)&(e0->edge_point).position.z = pvVar24;
          pvVar9 = std::
                   vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 *)&totfaces,(size_type)minp_2);
          pvVar12 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::operator[]
                              ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)&nfacesout
                               ,(ulong)(pvVar9->first + n_4));
          uVar2 = face_2._4_4_;
          **(uint **)&(e0->edge_point).position.z = face_2._4_4_;
          face_2._4_4_ = face_2._4_4_ + 1;
          Assimp::Vertex::SortBack(pvVar12,_i_6,uVar2);
          pvVar9 = std::
                   vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 *)&totfaces,(size_type)minp_2);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &spatial.mPositions.
                                super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(pvVar9->second + paStack_b00->mIndices[faceOut._4_4_]));
          local_30 = *pvVar13;
          pvVar9 = std::
                   vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 *)&totfaces,(size_type)minp_2);
          if (faceOut._4_4_ == paStack_b00->mNumIndices - 1) {
            local_18d8 = 0;
          }
          else {
            local_18d8 = faceOut._4_4_ + 1;
          }
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &spatial.mPositions.
                                super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(pvVar9->second + paStack_b00->mIndices[local_18d8]));
          maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = *pvVar13;
          if (local_30 <
              maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_) {
            std::swap<unsigned_int>
                      (&local_30,
                       (uint *)((long)&maptbl.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          }
          else {
            mydummy();
          }
          e1 = (Edge *)CONCAT44(maptbl.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,local_30);
          local_b18 = std::
                      map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                      ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                    *)&t_2,(key_type_conflict1 *)&e1);
          pvVar9 = std::
                   vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 *)&totfaces,(size_type)minp_2);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &spatial.mPositions.
                                super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(pvVar9->second + paStack_b00->mIndices[faceOut._4_4_]));
          local_30 = *pvVar13;
          pvVar9 = std::
                   vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 *)&totfaces,(size_type)minp_2);
          local_18f0 = faceOut._4_4_;
          if (faceOut._4_4_ == 0) {
            local_18f0 = paStack_b00->mNumIndices;
          }
          local_18f0 = local_18f0 - 1;
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &spatial.mPositions.
                                super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(pvVar9->second + paStack_b00->mIndices[local_18f0]));
          maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = *pvVar13;
          if (local_30 <
              maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_) {
            std::swap<unsigned_int>
                      (&local_30,
                       (uint *)((long)&maptbl.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          }
          else {
            mydummy();
          }
          kStack_b30 = CONCAT44(maptbl.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,local_30);
          local_b28 = std::
                      map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                      ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                    *)&t_2,&stack0xfffffffffffff4d0);
          uVar2 = face_2._4_4_;
          *(uint *)(*(long *)&(e0->edge_point).position.z + 0xc) = face_2._4_4_;
          face_2._4_4_ = face_2._4_4_ + 1;
          Assimp::Vertex::SortBack(&local_b18->edge_point,_i_6,uVar2);
          uVar2 = face_2._4_4_;
          *(uint *)(*(long *)&(e0->edge_point).position.z + 4) = face_2._4_4_;
          face_2._4_4_ = face_2._4_4_ + 1;
          Assimp::Vertex::SortBack(&local_b28->edge_point,_i_6,uVar2);
          pvVar9 = std::
                   vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 *)&totfaces,(size_type)minp_2);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &spatial.mPositions.
                                super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(pvVar9->second + paStack_b00->mIndices[faceOut._4_4_]));
          uVar2 = *pvVar13;
          pvVar25 = std::
                    vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                    ::operator[]((vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                                  *)local_898,(ulong)uVar2);
          if ((pvVar25->first & 1U) == 0) {
            pvVar25->first = true;
            pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7f0,
                                 (ulong)uVar2);
            pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7b0,
                                 (ulong)*pvVar13);
            pvVar26 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0,
                                 (ulong)uVar2);
            uVar3 = *pvVar26;
            if (uVar3 < 3) {
              Assimp::Vertex::Vertex
                        ((Vertex *)&F.colors[7].b,mout,paStack_b00->mIndices[faceOut._4_4_]);
              memcpy(&pvVar25->second,&F.colors[7].b,0x110);
            }
            else {
              Assimp::Vertex::Vertex((Vertex *)&R.colors[7].b);
              Assimp::Vertex::Vertex((Vertex *)((long)&mp_1 + 4));
              for (mp_1._0_4_ = 0; (uint)mp_1 < uVar3; mp_1._0_4_ = (uint)mp_1 + 1) {
                if (local_a8 <= pvVar13[(uint)mp_1]) {
                  __assert_fail("adj[o] < totfaces",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Subdivision.cpp"
                                ,0x202,
                                "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                               );
                }
                pvVar12 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::operator[]
                                    ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)
                                     &nfacesout,(ulong)pvVar13[(uint)mp_1]);
                Assimp::Vertex::operator+=((Vertex *)&R.colors[7].b,pvVar12);
                nidx = 0;
                uVar4 = pvVar13[(uint)mp_1];
                pvVar9 = std::
                         vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                       *)&totfaces,0);
                if (uVar4 < pvVar9->first) {
                  f_3 = (aiFace *)0x0;
                  nidx = *(size_t *)nmesh_local;
                }
                else {
                  for (f_3 = (aiFace *)0x1; f_3 <= out_local;
                      f_3 = (aiFace *)((long)&f_3->mNumIndices + 1)) {
                    if ((f_3 == (aiFace *)out_local) ||
                       (pvVar9 = std::
                                 vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                               *)&totfaces,(size_type)f_3),
                       pvVar13[(uint)mp_1] < pvVar9->first)) {
                      nidx = *(size_t *)((nmesh_local - 8) + (long)f_3 * 8);
                      f_3 = (aiFace *)((long)&f_3[-1].mIndices + 7);
                      break;
                    }
                  }
                }
                vVar5 = pvVar13[(uint)mp_1];
                pvVar9 = std::
                         vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                       *)&totfaces,(size_type)f_3);
                if (*(uint *)(nidx + 8) <= vVar5 - pvVar9->first) {
                  __assert_fail("adj[o]-moffsets[nidx].first < mp->mNumFaces",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Subdivision.cpp"
                                ,0x215,
                                "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                               );
                }
                lVar6 = *(long *)(nidx + 0xd0);
                vVar5 = pvVar13[(uint)mp_1];
                pvVar9 = std::
                         vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                       *)&totfaces,(size_type)f_3);
                _m_1 = (uint *)(lVar6 + (ulong)(vVar5 - pvVar9->first) * 0x10);
                c0._7_1_ = 0;
                for (c0._0_4_ = 0; (uint)c0 < *_m_1; c0._0_4_ = (uint)c0 + 1) {
                  pvVar9 = std::
                           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                         *)&totfaces,(size_type)f_3);
                  pvVar26 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       &spatial.mPositions.
                                        super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (ulong)(pvVar9->second +
                                              *(int *)(*(long *)(_m_1 + 2) + (ulong)(uint)c0 * 4)));
                  if (*pvVar26 == uVar2) {
                    local_30 = uVar2;
                    pvVar9 = std::
                             vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                           *)&totfaces,(size_type)f_3);
                    local_1920 = (uint)c0;
                    if ((uint)c0 == 0) {
                      local_1920 = *_m_1;
                    }
                    local_1920 = local_1920 - 1;
                    pvVar26 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         &spatial.mPositions.
                                          super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (ulong)(pvVar9->second +
                                                *(int *)(*(long *)(_m_1 + 2) + (ulong)local_1920 * 4
                                                        )));
                    maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ = *pvVar26;
                    if (local_30 <
                        maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
                      std::swap<unsigned_int>
                                (&local_30,
                                 (uint *)((long)&maptbl.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + 4));
                    }
                    else {
                      mydummy();
                    }
                    c1 = (Edge *)CONCAT44(maptbl.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                          local_30);
                    local_ea8 = std::
                                map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                              *)&t_2,(key_type_conflict1 *)&c1);
                    local_30 = uVar2;
                    pvVar9 = std::
                             vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                           *)&totfaces,(size_type)f_3);
                    if ((uint)c0 == *_m_1 - 1) {
                      local_1938 = 0;
                    }
                    else {
                      local_1938 = (uint)c0 + 1;
                    }
                    pvVar26 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         &spatial.mPositions.
                                          super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (ulong)(pvVar9->second +
                                                *(int *)(*(long *)(_m_1 + 2) + (ulong)local_1938 * 4
                                                        )));
                    maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ = *pvVar26;
                    if (local_30 <
                        maptbl.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
                      std::swap<unsigned_int>
                                (&local_30,
                                 (uint *)((long)&maptbl.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + 4));
                    }
                    else {
                      mydummy();
                    }
                    local_ec0 = CONCAT44(maptbl.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                         local_30);
                    local_eb8 = std::
                                map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                ::operator[]((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
                                              *)&t_2,&local_ec0);
                    Assimp::operator+((Vertex *)&divsq,&local_ea8->midpoint,&local_eb8->midpoint);
                    Assimp::Vertex::operator+=((Vertex *)((long)&mp_1 + 4),(Vertex *)&divsq);
                    c0._7_1_ = 1;
                    break;
                  }
                }
                if ((c0._7_1_ & 1) == 0) {
                  __assert_fail("haveit",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Subdivision.cpp"
                                ,0x232,
                                "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                               );
                }
                if ((c0._7_1_ & 1) == 0) {
                  pLVar15 = Assimp::DefaultLogger::get();
                  Assimp::Logger::warn(pLVar15,"OBJ: no name for material library specified.");
                }
              }
              local_fd4 = (float)uVar3;
              local_fd8 = 1.0 / (local_fd4 * local_fd4);
              Assimp::Vertex::Vertex(&local_1418,mout,paStack_b00->mIndices[faceOut._4_4_]);
              Assimp::operator*(&local_1308,&local_1418,(local_fd4 + -3.0) / local_fd4);
              Assimp::operator*(&local_1528,(Vertex *)((long)&mp_1 + 4),local_fd8);
              Assimp::operator+(&local_11f8,&local_1308,&local_1528);
              Assimp::operator*((Vertex *)
                                &tmp.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage,(Vertex *)&R.colors[7].b
                                ,local_fd8);
              Assimp::operator+(&local_10e8,&local_11f8,
                                (Vertex *)
                                &tmp.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage);
              memcpy(&pvVar25->second,&local_10e8,0x110);
            }
          }
          uVar2 = face_2._4_4_;
          *(uint *)(*(long *)&(e0->edge_point).position.z + 8) = face_2._4_4_;
          face_2._4_4_ = face_2._4_4_ + 1;
          Assimp::Vertex::SortBack(&pvVar25->second,_i_6,uVar2);
        }
      }
    }
    std::vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
    ::~vector((vector<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
               *)local_898);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7f0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7b0);
    std::
    map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
    ::~map((map<unsigned_long,_CatmullClarkSubdivider::Edge,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CatmullClarkSubdivider::Edge>_>_>
            *)&t_2);
    ppaVar7 = out_local;
    if (eh_tmp1__ != 1) {
      std::allocator<aiMesh_*>::allocator((allocator<aiMesh_*> *)((long)&i_9 + 7));
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1650,(size_type)ppaVar7,
                 (allocator<aiMesh_*> *)((long)&i_9 + 7));
      std::allocator<aiMesh_*>::~allocator((allocator<aiMesh_*> *)((long)&i_9 + 7));
      nmesh_00 = out_local;
      ppaVar7 = _eh_tmp0__;
      ppaVar27 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::front
                           ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1650);
      InternSubdivide(this,ppaVar7,(size_t)nmesh_00,ppaVar27,eh_tmp1__ - 1);
      for (local_1660 = (aiMesh **)0x0; local_1660 < out_local;
          local_1660 = (aiMesh **)((long)local_1660 + 1)) {
        paVar20 = _eh_tmp0__[(long)local_1660];
        if (paVar20 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(paVar20);
          operator_delete(paVar20);
        }
        ppaVar27 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                             ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1650,
                              (size_type)local_1660);
        _eh_tmp0__[(long)local_1660] = *ppaVar27;
      }
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_1650);
    }
    std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::~vector
              ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)&nfacesout);
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&totfaces);
    Assimp::SpatialSort::~SpatialSort((SpatialSort *)local_78);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &spatial.mPositions.
                super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
LAB_00b89fab:
  if (*puVar19 <=
      (uint)new_points.
            super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00b8a01c;
  pvVar9 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)&totfaces,(size_type)&msh[-1].field_0x51f);
  pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &spatial.mPositions.
                        super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (ulong)(pvVar9->second +
                              *(int *)(*(long *)(puVar19 + 2) +
                                      (ulong)(uint)new_points.
                                                                                                      
                                                  super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                      * 4)));
  if (*pvVar13 == (value_type)_fidx) {
    new_points.
    super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    goto LAB_00b8a01c;
  }
  new_points.
  super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       (uint)new_points.
             super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  goto LAB_00b89fab;
LAB_00b8a01c:
  if ((new_points.
       super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    __assert_fail("haveit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Subdivision.cpp"
                  ,0x193,
                  "void CatmullClarkSubdivider::InternSubdivide(const aiMesh *const *, size_t, aiMesh **, unsigned int)"
                 );
  }
  if ((new_points.
       super__Vector_base<std::pair<bool,_Assimp::Vertex>,_std::allocator<std::pair<bool,_Assimp::Vertex>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    pLVar15 = Assimp::DefaultLogger::get();
    Assimp::Logger::debug(pLVar15,"Catmull-Clark Subdivider: Index not used");
  }
LAB_00b8a0a0:
  n_3._4_4_ = n_3._4_4_ + 1;
  goto LAB_00b89e50;
}

Assistant:

void CatmullClarkSubdivider::InternSubdivide (
    const aiMesh* const * smesh,
    size_t nmesh,
    aiMesh** out,
    unsigned int num
    )
{
    ai_assert(NULL != smesh && NULL != out);
    INIT_EDGE_HASH_TEMPORARIES();

    // no subdivision requested or end of recursive refinement
    if (!num) {
        return;
    }

    UIntVector maptbl;
    SpatialSort spatial;

    // ---------------------------------------------------------------------
    // 0. Offset table to index all meshes continuously, generate a spatially
    // sorted representation of all vertices in all meshes.
    // ---------------------------------------------------------------------
    typedef std::pair<unsigned int,unsigned int> IntPair;
    std::vector<IntPair> moffsets(nmesh);
    unsigned int totfaces = 0, totvert = 0;
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* mesh = smesh[t];

        spatial.Append(mesh->mVertices,mesh->mNumVertices,sizeof(aiVector3D),false);
        moffsets[t] = IntPair(totfaces,totvert);

        totfaces += mesh->mNumFaces;
        totvert  += mesh->mNumVertices;
    }

    spatial.Finalize();
    const unsigned int num_unique = spatial.GenerateMappingTable(maptbl,ComputePositionEpsilon(smesh,nmesh));


#define FLATTEN_VERTEX_IDX(mesh_idx, vert_idx) (moffsets[mesh_idx].second+vert_idx)
#define   FLATTEN_FACE_IDX(mesh_idx, face_idx) (moffsets[mesh_idx].first+face_idx)

    // ---------------------------------------------------------------------
    // 1. Compute the centroid point for all faces
    // ---------------------------------------------------------------------
    std::vector<Vertex> centroids(totfaces);
    unsigned int nfacesout = 0;
    for (size_t t = 0, n = 0; t < nmesh; ++t) {
        const aiMesh* mesh = smesh[t];
        for (unsigned int i = 0; i < mesh->mNumFaces;++i,++n)
        {
            const aiFace& face = mesh->mFaces[i];
            Vertex& c = centroids[n];

            for (unsigned int a = 0; a < face.mNumIndices;++a) {
                c += Vertex(mesh,face.mIndices[a]);
            }

            c /= static_cast<float>(face.mNumIndices);
            nfacesout += face.mNumIndices;
        }
    }

    {
    // we want edges to go away before the recursive calls so begin a new scope
    EdgeMap edges;

    // ---------------------------------------------------------------------
    // 2. Set each edge point to be the average of all neighbouring
    // face points and original points. Every edge exists twice
    // if there is a neighboring face.
    // ---------------------------------------------------------------------
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* mesh = smesh[t];

        for (unsigned int i = 0; i < mesh->mNumFaces;++i)   {
            const aiFace& face = mesh->mFaces[i];

            for (unsigned int p =0; p< face.mNumIndices; ++p) {
                const unsigned int id[] = {
                    face.mIndices[p],
                    face.mIndices[p==face.mNumIndices-1?0:p+1]
                };
                const unsigned int mp[] = {
                    maptbl[FLATTEN_VERTEX_IDX(t,id[0])],
                    maptbl[FLATTEN_VERTEX_IDX(t,id[1])]
                };

                Edge& e = edges[MAKE_EDGE_HASH(mp[0],mp[1])];
                e.ref++;
                if (e.ref<=2) {
                    if (e.ref==1) { // original points (end points) - add only once
                        e.edge_point = e.midpoint = Vertex(mesh,id[0])+Vertex(mesh,id[1]);
                        e.midpoint *= 0.5f;
                    }
                    e.edge_point += centroids[FLATTEN_FACE_IDX(t,i)];
                }
            }
        }
    }

    // ---------------------------------------------------------------------
    // 3. Normalize edge points
    // ---------------------------------------------------------------------
    {unsigned int bad_cnt = 0;
    for (EdgeMap::iterator it = edges.begin(); it != edges.end(); ++it) {
        if ((*it).second.ref < 2) {
            ai_assert((*it).second.ref);
            ++bad_cnt;
        }
        (*it).second.edge_point *= 1.f/((*it).second.ref+2.f);
    }

    if (bad_cnt) {
        // Report the number of bad edges. bad edges are referenced by less than two
        // faces in the mesh. They occur at outer model boundaries in non-closed
        // shapes.
        ASSIMP_LOG_DEBUG_F("Catmull-Clark Subdivider: got ", bad_cnt, " bad edges touching only one face (totally ", 
            static_cast<unsigned int>(edges.size()), " edges). ");
    }}

    // ---------------------------------------------------------------------
    // 4. Compute a vertex-face adjacency table. We can't reuse the code
    // from VertexTriangleAdjacency because we need the table for multiple
    // meshes and out vertex indices need to be mapped to distinct values
    // first.
    // ---------------------------------------------------------------------
    UIntVector faceadjac(nfacesout), cntadjfac(maptbl.size(),0), ofsadjvec(maptbl.size()+1,0); {
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* const minp = smesh[t];
        for (unsigned int i = 0; i < minp->mNumFaces; ++i) {

            const aiFace& f = minp->mFaces[i];
            for (unsigned int n = 0; n < f.mNumIndices; ++n) {
                ++cntadjfac[maptbl[FLATTEN_VERTEX_IDX(t,f.mIndices[n])]];
            }
        }
    }
    unsigned int cur = 0;
    for (size_t i = 0; i < cntadjfac.size(); ++i) {
        ofsadjvec[i+1] = cur;
        cur += cntadjfac[i];
    }
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* const minp = smesh[t];
        for (unsigned int i = 0; i < minp->mNumFaces; ++i) {

            const aiFace& f = minp->mFaces[i];
            for (unsigned int n = 0; n < f.mNumIndices; ++n) {
                faceadjac[ofsadjvec[1+maptbl[FLATTEN_VERTEX_IDX(t,f.mIndices[n])]]++] = FLATTEN_FACE_IDX(t,i);
            }
        }
    }

    // check the other way round for consistency
#ifdef ASSIMP_BUILD_DEBUG

    for (size_t t = 0; t < ofsadjvec.size()-1; ++t) {
        for (unsigned int m = 0; m <  cntadjfac[t]; ++m) {
            const unsigned int fidx = faceadjac[ofsadjvec[t]+m];
            ai_assert(fidx < totfaces);
            for (size_t n = 1; n < nmesh; ++n) {

                if (moffsets[n].first > fidx) {
                    const aiMesh* msh = smesh[--n];
                    const aiFace& f = msh->mFaces[fidx-moffsets[n].first];

                    bool haveit = false;
                    for (unsigned int i = 0; i < f.mNumIndices; ++i) {
                        if (maptbl[FLATTEN_VERTEX_IDX(n,f.mIndices[i])]==(unsigned int)t) {
                            haveit = true;
                            break;
                        }
                    }
                    ai_assert(haveit);
                    if (!haveit) {
                        ASSIMP_LOG_DEBUG("Catmull-Clark Subdivider: Index not used");
                    }
                    break;
                }
            }
        }
    }

#endif
    }

#define GET_ADJACENT_FACES_AND_CNT(vidx,fstartout,numout) \
    fstartout = &faceadjac[ofsadjvec[vidx]], numout = cntadjfac[vidx]

    typedef std::pair<bool,Vertex> TouchedOVertex;
    std::vector<TouchedOVertex > new_points(num_unique,TouchedOVertex(false,Vertex()));
    // ---------------------------------------------------------------------
    // 5. Spawn a quad from each face point to the corresponding edge points
    // the original points being the fourth quad points.
    // ---------------------------------------------------------------------
    for (size_t t = 0; t < nmesh; ++t) {
        const aiMesh* const minp = smesh[t];
        aiMesh* const mout = out[t] = new aiMesh();

        for (unsigned int a  = 0; a < minp->mNumFaces; ++a) {
            mout->mNumFaces += minp->mFaces[a].mNumIndices;
        }

        // We need random access to the old face buffer, so reuse is not possible.
        mout->mFaces = new aiFace[mout->mNumFaces];

        mout->mNumVertices = mout->mNumFaces*4;
        mout->mVertices = new aiVector3D[mout->mNumVertices];

        // quads only, keep material index
        mout->mPrimitiveTypes = aiPrimitiveType_POLYGON;
        mout->mMaterialIndex = minp->mMaterialIndex;

        if (minp->HasNormals()) {
            mout->mNormals = new aiVector3D[mout->mNumVertices];
        }

        if (minp->HasTangentsAndBitangents()) {
            mout->mTangents = new aiVector3D[mout->mNumVertices];
            mout->mBitangents = new aiVector3D[mout->mNumVertices];
        }

        for(unsigned int i = 0; minp->HasTextureCoords(i); ++i) {
            mout->mTextureCoords[i] = new aiVector3D[mout->mNumVertices];
            mout->mNumUVComponents[i] = minp->mNumUVComponents[i];
        }

        for(unsigned int i = 0; minp->HasVertexColors(i); ++i) {
            mout->mColors[i] = new aiColor4D[mout->mNumVertices];
        }

        mout->mNumVertices = mout->mNumFaces<<2u;
        for (unsigned int i = 0, v = 0, n = 0; i < minp->mNumFaces;++i) {

            const aiFace& face = minp->mFaces[i];
            for (unsigned int a = 0; a < face.mNumIndices;++a)  {

                // Get a clean new face.
                aiFace& faceOut = mout->mFaces[n++];
                faceOut.mIndices = new unsigned int [faceOut.mNumIndices = 4];

                // Spawn a new quadrilateral (ccw winding) for this original point between:
                // a) face centroid
                centroids[FLATTEN_FACE_IDX(t,i)].SortBack(mout,faceOut.mIndices[0]=v++);

                // b) adjacent edge on the left, seen from the centroid
                const Edge& e0 = edges[MAKE_EDGE_HASH(maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a])],
                    maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a==face.mNumIndices-1?0:a+1])
                    ])];  // fixme: replace with mod face.mNumIndices?

                // c) adjacent edge on the right, seen from the centroid
                const Edge& e1 = edges[MAKE_EDGE_HASH(maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a])],
                    maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[!a?face.mNumIndices-1:a-1])
                    ])];  // fixme: replace with mod face.mNumIndices?

                e0.edge_point.SortBack(mout,faceOut.mIndices[3]=v++);
                e1.edge_point.SortBack(mout,faceOut.mIndices[1]=v++);

                // d= original point P with distinct index i
                // F := 0
                // R := 0
                // n := 0
                // for each face f containing i
                //    F := F+ centroid of f
                //    R := R+ midpoint of edge of f from i to i+1
                //    n := n+1
                //
                // (F+2R+(n-3)P)/n
                const unsigned int org = maptbl[FLATTEN_VERTEX_IDX(t,face.mIndices[a])];
                TouchedOVertex& ov = new_points[org];

                if (!ov.first) {
                    ov.first = true;

                    const unsigned int* adj; unsigned int cnt;
                    GET_ADJACENT_FACES_AND_CNT(org,adj,cnt);

                    if (cnt < 3) {
                        ov.second = Vertex(minp,face.mIndices[a]);
                    }
                    else {

                        Vertex F,R;
                        for (unsigned int o = 0; o < cnt; ++o) {
                            ai_assert(adj[o] < totfaces);
                            F += centroids[adj[o]];

                            // adj[0] is a global face index - search the face in the mesh list
                            const aiMesh* mp = NULL;
                            size_t nidx;

                            if (adj[o] < moffsets[0].first) {
                                mp = smesh[nidx=0];
                            }
                            else {
                                for (nidx = 1; nidx<= nmesh; ++nidx) {
                                    if (nidx == nmesh ||moffsets[nidx].first > adj[o]) {
                                        mp = smesh[--nidx];
                                        break;
                                    }
                                }
                            }

                            ai_assert(adj[o]-moffsets[nidx].first < mp->mNumFaces);
                            const aiFace& f = mp->mFaces[adj[o]-moffsets[nidx].first];
                            bool haveit = false;

                            // find our original point in the face
                            for (unsigned int m = 0; m < f.mNumIndices; ++m) {
                                if (maptbl[FLATTEN_VERTEX_IDX(nidx,f.mIndices[m])] == org) {

                                    // add *both* edges. this way, we can be sure that we add
                                    // *all* adjacent edges to R. In a closed shape, every
                                    // edge is added twice - so we simply leave out the
                                    // factor 2.f in the amove formula and get the right
                                    // result.

                                    const Edge& c0 = edges[MAKE_EDGE_HASH(org,maptbl[FLATTEN_VERTEX_IDX(
                                        nidx,f.mIndices[!m?f.mNumIndices-1:m-1])])];
                                    // fixme: replace with mod face.mNumIndices?

                                    const Edge& c1 = edges[MAKE_EDGE_HASH(org,maptbl[FLATTEN_VERTEX_IDX(
                                        nidx,f.mIndices[m==f.mNumIndices-1?0:m+1])])];
                                    // fixme: replace with mod face.mNumIndices?
                                    R += c0.midpoint+c1.midpoint;

                                    haveit = true;
                                    break;
                                }
                            }

                            // this invariant *must* hold if the vertex-to-face adjacency table is valid
                            ai_assert(haveit);
                            if ( !haveit ) {
                                ASSIMP_LOG_WARN( "OBJ: no name for material library specified." );
                            }
                        }

                        const float div = static_cast<float>(cnt), divsq = 1.f/(div*div);
                        ov.second = Vertex(minp,face.mIndices[a])*((div-3.f) / div) + R*divsq + F*divsq;
                    }
                }
                ov.second.SortBack(mout,faceOut.mIndices[2]=v++);
            }
        }
    }
    }  // end of scope for edges, freeing its memory

    // ---------------------------------------------------------------------
    // 7. Apply the next subdivision step.
    // ---------------------------------------------------------------------
    if (num != 1) {
        std::vector<aiMesh*> tmp(nmesh);
        InternSubdivide (out,nmesh,&tmp.front(),num-1);
        for (size_t i = 0; i < nmesh; ++i) {
            delete out[i];
            out[i] = tmp[i];
        }
    }
}